

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_wd_add_subtree(lyd_node **root,lyd_node *last_parent,lyd_node *subroot,lys_node *schema,
                      int toplevel,int options,unres_data *unres)

{
  lyd_node *plVar1;
  lys_iffeature *plVar2;
  UNRES_ITEM UVar3;
  int iVar4;
  LYS_NODE LVar5;
  uint uVar6;
  ly_set *set;
  lys_node *plVar7;
  lyd_node *plVar8;
  lys_node *plVar9;
  lys_node *node;
  lys_iffeature **pplVar10;
  lyd_node *plVar11;
  long lVar12;
  lys_node **pplVar13;
  lyd_node **pplVar14;
  ulong uVar15;
  ulong local_58;
  lyd_node *local_50;
  lyd_node *local_40;
  
  if (((char)options != '\0') && ((schema->flags & 2) != 0)) {
    return 0;
  }
  if ((toplevel == 0) ||
     ((schema->nodetype & (LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) == LYS_UNKNOWN)) {
    if (subroot == (lyd_node *)0x0) {
      plVar7 = schema->parent;
      if (((plVar7 != (lys_node *)0x0) && (plVar7->nodetype == LYS_AUGMENT)) &&
         (plVar7 = lys_is_disabled(plVar7,0), plVar7 != (lys_node *)0x0)) {
        return 0;
      }
      plVar7 = lys_is_disabled(schema,0);
      if (plVar7 != (lys_node *)0x0) {
        return 0;
      }
    }
    LVar5 = schema->nodetype;
    set = (ly_set *)0x0;
    plVar8 = last_parent;
    switch(LVar5) {
    case LYS_CONTAINER:
      local_40 = subroot;
      if (subroot == (lyd_node *)0x0) {
        lVar12._0_2_ = schema[1].flags;
        lVar12._2_1_ = schema[1].ext_size;
        lVar12._3_1_ = schema[1].iffeature_size;
        lVar12._4_1_ = schema[1].padding[0];
        lVar12._5_1_ = schema[1].padding[1];
        lVar12._6_1_ = schema[1].padding[2];
        lVar12._7_1_ = schema[1].padding[3];
        if (lVar12 != 0) {
LAB_0015e15a:
          set = (ly_set *)0x0;
          goto switchD_0015dc7f_caseD_3;
        }
        plVar8 = _lyd_new(last_parent,schema,1);
        if (last_parent == (lyd_node *)0x0) {
          if (*root == (lyd_node *)0x0) {
            *root = plVar8;
          }
          else {
            lyd_insert_sibling(root,plVar8);
          }
        }
        local_40 = plVar8;
        if (((options & 0x208eU) == 0) &&
           (((((plVar8->field_0x9 & 8) != 0 &&
              (iVar4 = unres_data_add(unres,plVar8,UNRES_WHEN), iVar4 == -1)) ||
             ((uVar6 = resolve_applies_must(plVar8), (uVar6 & 1) != 0 &&
              (iVar4 = unres_data_add(unres,plVar8,UNRES_MUST), iVar4 == -1)))) ||
            (((uVar6 & 2) != 0 &&
             (iVar4 = unres_data_add(unres,plVar8,UNRES_MUST_INOUT), iVar4 == -1))))))
        goto LAB_0015e2ef;
      }
      break;
    case LYS_CHOICE:
      if (toplevel == 0) {
        if (subroot != (lyd_node *)0x0) goto LAB_0015e0a3;
LAB_0015e12d:
        plVar7 = (lys_node *)schema[1].dsc;
        if (plVar7 == (lys_node *)0x0) goto LAB_0015e15a;
      }
      else {
        if (*root == (lyd_node *)0x0) goto LAB_0015e12d;
LAB_0015e0a3:
        pplVar14 = &subroot->child;
        if (toplevel != 0) {
          pplVar14 = root;
        }
        do {
          plVar8 = *pplVar14;
          if (plVar8 == (lyd_node *)0x0) goto LAB_0015e12d;
          plVar9 = lys_parent(plVar8->schema);
          plVar7 = plVar8->schema;
          while (((node = plVar9, node != (lys_node *)0x0 && (node != schema)) &&
                 ((node->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN))) {
            plVar9 = lys_parent(node);
            plVar7 = node;
          }
          pplVar14 = &plVar8->next;
        } while (node != schema);
        if ((schema == (lys_node *)0x0) || (plVar7 == (lys_node *)0x0)) {
          __assert_fail("siter && siter_prev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                        ,0x1810,
                        "int lyd_wd_add_subtree(struct lyd_node **, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int, struct unres_data *)"
                       );
        }
      }
      iVar4 = lyd_wd_add_subtree(root,last_parent,subroot,plVar7,toplevel,options,unres);
      set = (ly_set *)0x0;
      goto LAB_0015dce4;
    case LYS_CHOICE|LYS_CONTAINER:
    case LYS_LEAF|LYS_CONTAINER:
    case LYS_LEAF|LYS_CHOICE:
    case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
      goto switchD_0015dc7f_caseD_3;
    case LYS_LEAF:
    case LYS_LEAFLIST:
      if (subroot == (lyd_node *)0x0) {
        set = (ly_set *)0x0;
      }
      else {
        set = ly_set_new();
        if (set == (ly_set *)0x0) goto LAB_0015e2ef;
        lyd_get_node_siblings(subroot->child,schema,set);
        if (set->number != 0) goto switchD_0015dc7f_caseD_3;
        LVar5 = schema->nodetype;
      }
      if (LVar5 != LYS_LEAF) {
        if ((schema->module->field_0x40 & 0xc) == 0) goto switchD_0015dc7f_caseD_3;
        local_58 = (ulong)schema->padding[2];
        if (local_58 == 0) {
          if (*(int *)&schema[1].priv == 0) {
            pplVar10 = &schema[1].iffeature;
            while (plVar2 = *pplVar10, plVar2 != (lys_iffeature *)0x0) {
              if (plVar2[3].ext != (lys_ext_instance **)0x0) {
                plVar7 = (lys_node *)&plVar2[3].ext;
                local_58 = 1;
                goto LAB_0015df1f;
              }
              pplVar10 = (lys_iffeature **)&plVar2[2].features;
            }
          }
          goto switchD_0015dc7f_caseD_3;
        }
        plVar7 = schema[1].prev;
LAB_0015df1f:
        local_50 = (lyd_node *)0x0;
        for (uVar15 = 0; uVar15 != local_58; uVar15 = uVar15 + 1) {
          plVar8 = lyd_new_dummy(*root,last_parent,schema,
                                 *(char **)(plVar7->padding + uVar15 * 8 + -0x1c),1);
          if (plVar8 == (lyd_node *)0x0) goto LAB_0015e19a;
          plVar11 = plVar8;
          if ((local_50 != (lyd_node *)0x0) &&
             (plVar11 = local_50, plVar8->parent == (lyd_node *)0x0)) {
            plVar1 = local_50->prev;
            plVar1->next = plVar8;
            plVar8->prev = plVar1;
            local_50->prev = plVar8;
          }
          while( true ) {
            local_50 = plVar11;
            if (((options & 0x208eU) == 0) &&
               (((((plVar8->field_0x9 & 8) != 0 &&
                  (iVar4 = unres_data_add(unres,plVar8,UNRES_WHEN), iVar4 == -1)) ||
                 ((uVar6 = resolve_applies_must(plVar8), (uVar6 & 1) != 0 &&
                  (iVar4 = unres_data_add(unres,plVar8,UNRES_MUST), iVar4 == -1)))) ||
                (((uVar6 & 2) != 0 &&
                 (iVar4 = unres_data_add(unres,plVar8,UNRES_MUST_INOUT), iVar4 == -1))))))
            goto LAB_0015e19a;
            plVar8->validity = plVar8->validity & 0x7f;
            if (plVar8->schema == schema) break;
            plVar8 = plVar8->child;
            plVar11 = local_50;
          }
          if (*(short *)&plVar8[1].validity == 8) {
            UVar3 = UNRES_INSTID;
LAB_0015e027:
            iVar4 = unres_data_add(unres,plVar8,UVar3);
            if (iVar4 != 0) goto LAB_0015e19a;
          }
          else if (*(short *)&plVar8[1].validity == 9) {
            UVar3 = UNRES_LEAFREF;
            goto LAB_0015e027;
          }
        }
        if ((local_50 == (lyd_node *)0x0) || (local_50->parent != (lyd_node *)0x0)) {
          if (*root == (lyd_node *)0x0) goto LAB_0015e33c;
        }
        else if (*root == (lyd_node *)0x0) {
LAB_0015e33c:
          *root = local_50;
        }
        else {
          iVar4 = lyd_insert_sibling(root,local_50);
          if (iVar4 != 0) {
LAB_0015e19a:
            lyd_free_withsiblings(local_50);
            goto LAB_0015e2f2;
          }
        }
        lyd_wd_update_parents(local_50);
        goto switchD_0015dc7f_caseD_3;
      }
      plVar7 = schema[1].prev;
      if (plVar7 == (lys_node *)0x0) {
        if ((schema->flags & 0x40) != 0) goto switchD_0015dc7f_caseD_3;
        pplVar10 = &schema[1].iffeature;
        plVar7 = (lys_node *)0x0;
        while ((plVar2 = *pplVar10, plVar2 != (lys_iffeature *)0x0 && (plVar7 == (lys_node *)0x0)))
        {
          pplVar10 = (lys_iffeature **)&plVar2[2].features;
          plVar7 = (lys_node *)plVar2[3].ext;
        }
        if (plVar7 == (lys_node *)0x0) goto switchD_0015dc7f_caseD_3;
      }
      plVar8 = lyd_new_dummy(*root,last_parent,schema,(char *)plVar7,1);
      if ((plVar8 == (lyd_node *)0x0) ||
         (((plVar11 = plVar8, plVar8->parent == (lyd_node *)0x0 && (*root != (lyd_node *)0x0)) &&
          (iVar4 = lyd_insert_sibling(root,plVar8), iVar4 != 0)))) goto LAB_0015e23c;
      while( true ) {
        if (((options & 0x208eU) == 0) &&
           (((((plVar11->field_0x9 & 8) != 0 &&
              (iVar4 = unres_data_add(unres,plVar11,UNRES_WHEN), iVar4 == -1)) ||
             ((uVar6 = resolve_applies_must(plVar11), (uVar6 & 1) != 0 &&
              (iVar4 = unres_data_add(unres,plVar11,UNRES_MUST), iVar4 == -1)))) ||
            (((uVar6 & 2) != 0 &&
             (iVar4 = unres_data_add(unres,plVar11,UNRES_MUST_INOUT), iVar4 == -1))))))
        goto LAB_0015e23c;
        plVar11->validity = plVar11->validity & 0x7f;
        if (plVar11->schema == schema) break;
        plVar11 = plVar11->child;
      }
      lyd_wd_update_parents(plVar8);
      if (*(short *)&plVar11[1].validity == 8) {
        UVar3 = UNRES_INSTID;
LAB_0015e22b:
        iVar4 = unres_data_add(unres,plVar11,UVar3);
        if (iVar4 != 0) {
LAB_0015e23c:
          lyd_free(plVar8);
          return 1;
        }
      }
      else if (*(short *)&plVar11[1].validity == 9) {
        UVar3 = UNRES_LEAFREF;
        goto LAB_0015e22b;
      }
      if (*root == (lyd_node *)0x0) {
        *root = plVar8;
      }
      goto switchD_0015dc7f_caseD_3;
    default:
      local_40 = subroot;
      if (((LVar5 != LYS_USES) && (local_40 = subroot, LVar5 != LYS_CASE)) &&
         ((local_40 = subroot, LVar5 != LYS_NOTIF &&
          ((local_40 = subroot, LVar5 != LYS_INPUT && (local_40 = subroot, LVar5 != LYS_OUTPUT))))))
      {
        set = (ly_set *)0x0;
        if (LVar5 != LYS_LIST) goto switchD_0015dc7f_caseD_3;
        local_40 = subroot;
        if (subroot == (lyd_node *)0x0) goto LAB_0015e15a;
      }
    }
    set = ly_set_new();
    if (set != (ly_set *)0x0) {
      pplVar13 = &schema->child;
      while (plVar7 = *pplVar13, plVar7 != (lys_node *)0x0) {
        plVar11 = local_40;
        if ((plVar7->nodetype & (LYS_USES|LYS_CHOICE)) == LYS_UNKNOWN) {
          if ((plVar7->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) !=
              LYS_UNKNOWN) {
            if ((local_40 == (lyd_node *)0x0) ||
               (iVar4 = lyd_get_node_siblings(local_40->child,plVar7,set), iVar4 == 0)) {
              plVar11 = (lyd_node *)0x0;
              goto LAB_0015dd40;
            }
            if ((plVar7->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
              if (plVar7->nodetype != LYS_LEAF) {
                lVar12 = 0;
                while (lVar12 < (int)set->number) {
                  iVar4 = lyd_wd_add_subtree(root,(lyd_node *)(set->set).s[lVar12],
                                             (lyd_node *)(set->set).s[lVar12],plVar7,toplevel,
                                             options,unres);
                  lVar12 = lVar12 + 1;
                  if (iVar4 != 0) goto LAB_0015e2f2;
                }
              }
            }
            else {
              lyd_wd_leaflist_cleanup(set);
            }
            set->number = 0;
          }
        }
        else {
LAB_0015dd40:
          iVar4 = lyd_wd_add_subtree(root,plVar8,plVar11,plVar7,toplevel,options,unres);
          if (iVar4 != 0) goto LAB_0015e2f2;
        }
        pplVar13 = &plVar7->next;
      }
switchD_0015dc7f_caseD_3:
      ly_set_free(set);
      return 0;
    }
  }
  else {
    set = ly_set_new();
    if (set != (ly_set *)0x0) {
      if ((*root != (lyd_node *)0x0) &&
         (iVar4 = lyd_get_node_siblings(*root,schema,set), iVar4 != 0)) {
        for (lVar12 = 0; lVar12 < (int)set->number; lVar12 = lVar12 + 1) {
          if ((schema->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
            if ((schema->nodetype != LYS_LEAF) &&
               (iVar4 = lyd_wd_add_subtree(root,(lyd_node *)(set->set).s[lVar12],
                                           (lyd_node *)(set->set).s[lVar12],schema,0,options,unres),
               iVar4 != 0)) goto LAB_0015e2f2;
          }
          else {
            lyd_wd_leaflist_cleanup(set);
          }
        }
        goto switchD_0015dc7f_caseD_3;
      }
      iVar4 = lyd_wd_add_subtree(root,last_parent,(lyd_node *)0x0,schema,0,options,unres);
LAB_0015dce4:
      if (iVar4 == 0) goto switchD_0015dc7f_caseD_3;
      goto LAB_0015e2f2;
    }
  }
LAB_0015e2ef:
  set = (ly_set *)0x0;
LAB_0015e2f2:
  ly_set_free(set);
  return 1;
}

Assistant:

static int
lyd_wd_add_subtree(struct lyd_node **root, struct lyd_node *last_parent, struct lyd_node *subroot,
                   struct lys_node *schema, int toplevel, int options, struct unres_data *unres)
{
    struct ly_set *present = NULL;
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    int i, check_when_must;

    assert(root);

    if ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R)) {
        /* non LYD_OPT_DATA tree, status data are not expected here */
        return EXIT_SUCCESS;
    }

    if (options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        check_when_must = 0;
    } else {
        check_when_must = 1;
    }

    if (toplevel && (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_CONTAINER))) {
        /* search for the schema node instance */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((*root) && lyd_get_node_siblings(*root, schema, present)) {
            /* there are some instances */
            for (i = 0; i < (signed)present->number; i++) {
                if (schema->nodetype & LYS_LEAFLIST) {
                    lyd_wd_leaflist_cleanup(present);
                } else if (schema->nodetype != LYS_LEAF) {
                    if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], schema, 0, options, unres)) {
                        goto error;
                    }
                } /* else LYS_LEAF - nothing to do */
            }
        } else {
            /* no instance */
            if (lyd_wd_add_subtree(root, last_parent, NULL, schema, 0, options, unres)) {
                goto error;
            }
        }

        ly_set_free(present);
        return EXIT_SUCCESS;
    }

    /* skip disabled parts of schema */
    if (!subroot) {
        if (schema->parent && schema->parent->nodetype == LYS_AUGMENT) {
            if (lys_is_disabled(schema->parent, 0)) {
                /* ignore disabled augment */
                return EXIT_SUCCESS;
            }
        }
        if (lys_is_disabled(schema, 0)) {
            /* ignore disabled data */
            return EXIT_SUCCESS;
        }
    }

    switch (schema->nodetype) {
    case LYS_LIST:
        if (!subroot) {
            /* stop recursion */
            break;
        }
        /* no break */
    case LYS_CONTAINER:
        if (!subroot) {
            /* container does not exists, continue only in case of non presence container */
            if (((struct lys_node_container *)schema)->presence) {
                /* stop recursion */
                break;
            }
            /* always create empty NP container even if there is no default node,
             * because accroding to RFC, the empty NP container is always part of
             * accessible tree (e.g. for evaluating when and must conditions) */
            subroot = _lyd_new(last_parent, schema, 1);
            if (!last_parent) {
                if (*root) {
                    lyd_insert_sibling(root, subroot);
                } else {
                    *root = subroot;
                }
            }
            last_parent = subroot;

            /* remember the created container in unres */
            if (check_when_must) {
                if ((subroot->when_status & LYD_WHEN) && unres_data_add(unres, subroot, UNRES_WHEN) == -1) {
                    goto error;
                }
                i = resolve_applies_must(subroot);
                if ((i & 0x1) && (unres_data_add(unres, subroot, UNRES_MUST) == -1)) {
                    goto error;
                }
                if ((i & 0x2) && (unres_data_add(unres, subroot, UNRES_MUST_INOUT) == -1)) {
                    goto error;
                }
            }
        }
        /* no break */
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:

        /* recursion */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        LY_TREE_FOR(schema->child, siter) {
            if (siter->nodetype & (LYS_CHOICE | LYS_USES)) {
                /* go into without searching for data instance */
                if (lyd_wd_add_subtree(root, last_parent, subroot, siter, toplevel, options, unres)) {
                    goto error;
                }
            } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) {
                /* search for the schema node instance */
                if (subroot && lyd_get_node_siblings(subroot->child, siter, present)) {
                    /* there are some instances in the data root */
                    if (siter->nodetype & LYS_LEAFLIST) {
                        /* already have some leaflists, check that they are all
                         * default, if not, remove the default leaflists */
                        lyd_wd_leaflist_cleanup(present);
                    } else if (siter->nodetype != LYS_LEAF) {
                        /* recursion */
                        for (i = 0; i < (signed)present->number; i++) {
                            if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], siter, toplevel, options,
                                                   unres)) {
                                goto error;
                            }
                        }
                    } /* else LYS_LEAF - nothing to do */
                    ly_set_clean(present);
                } else {
                    /* no instance */
                    if (lyd_wd_add_subtree(root, last_parent, NULL, siter, toplevel, options, unres)) {
                        goto error;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        if (subroot) {
            /* default shortcase of a choice */
            present = ly_set_new();
            if (!present) {
                goto error;
            }
            lyd_get_node_siblings(subroot->child, schema, present);
            if (present->number) {
                /* the shortcase leaf(-list) exists, stop the processing */
                break;
            }
        }
        if (schema->nodetype == LYS_LEAF) {
            if (lyd_wd_add_leaf(root, last_parent, (struct lys_node_leaf*)schema, unres, check_when_must)) {
                return EXIT_FAILURE;
            }
        } else { /* LYS_LEAFLIST */
            if (lyd_wd_add_leaflist(root, last_parent, (struct lys_node_leaflist*)schema, unres, check_when_must)) {
                goto error;
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data root from the choice */
        iter = NULL;
        if ((toplevel && (*root)) || (!toplevel && subroot)) {
            LY_TREE_FOR(toplevel ? (*root) : subroot->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_wd_add_subtree(root, last_parent, subroot, ((struct lys_node_choice *)schema)->dflt,
                                       toplevel, options, unres)) {
                    goto error;
                }
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_wd_add_subtree(root, last_parent, subroot, siter_prev, toplevel, options, unres)) {
                goto error;
            }
        }
        break;
    default:
        /* LYS_ANYXML, LYS_ANYDATA, LYS_USES, LYS_GROUPING - do nothing */
        break;
    }

    ly_set_free(present);
    return EXIT_SUCCESS;

error:
    ly_set_free(present);
    return EXIT_FAILURE;
}